

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O0

DaysInYear days_since_jan(long days)

{
  bool bVar1;
  int iVar2;
  DaysInYear DVar3;
  long lStack_28;
  int threshold;
  long d;
  int year;
  long days_local;
  
  d._4_4_ = 0x7b2;
  lStack_28 = days;
  while( true ) {
    bVar1 = leapyear(d._4_4_);
    iVar2 = 0x16d;
    if (bVar1) {
      iVar2 = 0x16e;
    }
    if (lStack_28 < iVar2) break;
    lStack_28 = lStack_28 - iVar2;
    d._4_4_ = d._4_4_ + 1;
  }
  DaysInYear::DaysInYear((DaysInYear *)&days_local,d._4_4_,(int)lStack_28);
  DVar3.year = (undefined4)days_local;
  DVar3.days = days_local._4_4_;
  return DVar3;
}

Assistant:

DaysInYear days_since_jan(long days)
{
	auto year = 1970;
	auto d{ days };
	while (true)
	{
		auto threshold = leapyear(year) ? 366 : 365;
		if (d < threshold)
			break;
		d -= threshold;
		++year;
	}
	return DaysInYear(year, d);
}